

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O0

double logb(double __x)

{
  bool bVar1;
  int extraout_EAX;
  ExactFloat *in_RSI;
  ExactFloat *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar2;
  ExactFloat *a_local;
  
  bVar1 = ExactFloat::is_zero(in_RSI);
  if (bVar1) {
    ExactFloat::Infinity(in_RDI,-1);
    dVar2 = extraout_XMM0_Qa;
  }
  else {
    bVar1 = ExactFloat::is_inf(in_RSI);
    if (bVar1) {
      ExactFloat::Infinity(in_RDI,1);
      dVar2 = extraout_XMM0_Qa_00;
    }
    else {
      bVar1 = ExactFloat::is_nan(in_RSI);
      if (bVar1) {
        ExactFloat::ExactFloat(in_RDI,in_RSI);
        dVar2 = extraout_XMM0_Qa_01;
      }
      else {
        ExactFloat::exp(in_RSI,__x_00);
        ExactFloat::ExactFloat(in_RDI,extraout_EAX + -1);
        dVar2 = extraout_XMM0_Qa_02;
      }
    }
  }
  return dVar2;
}

Assistant:

ExactFloat logb(const ExactFloat& a) {
  if (a.is_zero()) return ExactFloat::Infinity(-1);
  if (a.is_inf()) return ExactFloat::Infinity(+1);  // Even if a < 0.
  if (a.is_nan()) return a;
  // exp() assumes the significand is in the range [0.5,1).
  return ExactFloat(a.exp() - 1);
}